

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool __thiscall
Function_Template::form1_ProjectionProfile::anon_class_8_1_a8c68091::operator()
          (anon_class_8_1_a8c68091 *this,uint32_t v)

{
  uint32_t v_local;
  anon_class_8_1_a8c68091 *this_local;
  
  return *this->value == v;
}

Assistant:

bool form2_ProjectionProfile(ProjectionProfileForm2 ProjectionProfile)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        const bool horizontal = (randomValue<int>(2) == 0);

        std::vector < uint32_t > projection;
        ProjectionProfile( image, horizontal, projection );

        const uint32_t value = (horizontal ? image.height() : image.width()) * intensity;

        return projection.size() == (horizontal ? image.width() : image.height()) &&
            std::all_of( projection.begin(), projection.end(), [&value]( uint32_t v ) { return value == v; } );
    }